

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

bool __thiscall
cfd::ConfidentialTransactionContext::IsFindTxOut
          (ConfidentialTransactionContext *this,Address *address,uint32_t *index,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes)

{
  bool bVar1;
  uint32_t uVar2;
  Script local_60;
  
  if (indexes == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    uVar2 = (**(code **)(*(long *)this + 0x80))(this);
    bVar1 = true;
    if (index != (uint32_t *)0x0) {
      *index = uVar2;
    }
  }
  else {
    cfd::core::Address::GetLockingScript();
    bVar1 = IsFindTxOut(this,&local_60,index,indexes);
    core::Script::~Script(&local_60);
  }
  return bVar1;
}

Assistant:

bool ConfidentialTransactionContext::IsFindTxOut(
    const Address& address, uint32_t* index,
    std::vector<uint32_t>* indexes) const {
  if (indexes != nullptr) {
    return IsFindTxOut(address.GetLockingScript(), index, indexes);
  }
  try {
    uint32_t temp_index = GetTxOutIndex(address);
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    if (except.GetErrorCode() == CfdError::kCfdIllegalArgumentError) {
      return false;
    } else {
      throw except;
    }
  }
}